

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O0

GherkinLine * GherkinLine_new(wchar_t *line_text,wchar_t line_number)

{
  GherkinLine *pGVar1;
  _Bool local_21;
  GherkinLine *line;
  wchar_t line_number_local;
  wchar_t *line_text_local;
  
  pGVar1 = (GherkinLine *)malloc(0x18);
  pGVar1->line_number = line_number;
  pGVar1->indent = 0;
  pGVar1->line_text = line_text;
  pGVar1->trimmed_line = line_text;
  while( true ) {
    local_21 = false;
    if (*pGVar1->trimmed_line != L'\0') {
      local_21 = StringUtilities_is_whitespace(*pGVar1->trimmed_line);
    }
    if (local_21 == false) break;
    pGVar1->trimmed_line = pGVar1->trimmed_line + 1;
    pGVar1->indent = pGVar1->indent + 1;
  }
  return pGVar1;
}

Assistant:

const GherkinLine* GherkinLine_new(const wchar_t* line_text, int line_number) {
    GherkinLine* line = (GherkinLine*)malloc(sizeof(GherkinLine));
    line->line_number = line_number;
    line->indent = 0;
    line->line_text = line_text;
    line->trimmed_line = line_text;
    while (line->trimmed_line[0] != '\0' && StringUtilities_is_whitespace(line->trimmed_line[0])) {
        ++line->trimmed_line;
        ++line->indent;
    }
    return line;
}